

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O2

void yyml::nn::ReLU<double>(Variable<double> *v,Variable<double> *result)

{
  double dVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  _Bind<void_(*(yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*))(yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*)>
  local_30;
  
  local_30._M_f = ReLUBackward<double>;
  local_30._M_bound_args.
  super__Tuple_impl<0UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>.
  super__Tuple_impl<1UL,_yyml::nn::Variable<double>_*>.
  super__Head_base<1UL,_yyml::nn::Variable<double>_*,_false>._M_head_impl =
       (_Head_base<1UL,_yyml::nn::Variable<double>_*,_false>)
       (_Head_base<1UL,_yyml::nn::Variable<double>_*,_false>)result;
  local_30._M_bound_args.
  super__Tuple_impl<0UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>.
  super__Head_base<0UL,_yyml::nn::Variable<double>_*,_false>._M_head_impl = v;
  std::function<void()>::operator=((function<void()> *)&(result->autograd_).backward_fn,&local_30);
  local_30._M_f = (_func_void_Variable<double>_ptr_Variable<double>_ptr *)&v->autograd_;
  std::vector<yyml::nn::Autograd<double>*,std::allocator<yyml::nn::Autograd<double>*>>::
  _M_assign_aux<yyml::nn::Autograd<double>*const*>
            ((vector<yyml::nn::Autograd<double>*,std::allocator<yyml::nn::Autograd<double>*>> *)
             &result->autograd_,&local_30,&local_30._M_bound_args);
  uVar2 = (v->values_).shape_.total;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    dVar1 = (v->values_).data_[uVar3];
    (result->values_).data_[uVar3] = (double)(-(ulong)(0.0 <= dVar1) & (ulong)dVar1);
  }
  return;
}

Assistant:

void ReLU(Variable<Type>* v, Variable<Type>* result) {
  result->autograd_.backward_fn = std::bind(ReLUBackward<Type>, v, result);
  result->autograd_.next = {&v->autograd_};
  for (size_t i = 0; i < v->values_.total(); i++) {
    result->values_.data_[i] =
        v->values_.data_[i] >= 0 ? v->values_.data_[i] : 0;
  }
}